

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>,slang::syntax::SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *args)

{
  SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *this_00;
  SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *)allocate(this,0x30,8);
  slang::syntax::SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>::SyntaxList
            (this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }